

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void __thiscall Fossilize::StateRecorder::Impl::~Impl(Impl *this)

{
  Impl *this_local;
  
  sync_thread(this);
  {unnamed_type#1}::~Impl((_unnamed_type_1_ *)&this->record_data);
  std::thread::~thread(&this->worker_thread);
  std::
  queue<Fossilize::WorkItem,_std::deque<Fossilize::WorkItem,_std::allocator<Fossilize::WorkItem>_>_>
  ::~queue(&this->record_queue);
  std::condition_variable::~condition_variable(&this->record_cv);
  std::
  unordered_map<VkShaderModuleIdentifierEXT,_VkShaderModule_T_*,_std::hash<VkShaderModuleIdentifierEXT>,_std::equal_to<VkShaderModuleIdentifierEXT>,_std::allocator<std::pair<const_VkShaderModuleIdentifierEXT,_VkShaderModule_T_*>_>_>
  ::~unordered_map(&this->identifier_to_module);
  std::
  unordered_map<unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::StateRecorder::Impl::SubpassMetaStorage>_>_>
  ::~unordered_map(&this->render_pass_hash_to_subpass_meta);
  std::
  unordered_map<VkSampler_T_*,_unsigned_long,_std::hash<VkSampler_T_*>,_std::equal_to<VkSampler_T_*>,_std::allocator<std::pair<VkSampler_T_*const,_unsigned_long>_>_>
  ::~unordered_map(&this->sampler_to_hash);
  std::
  unordered_map<VkRenderPass_T_*,_unsigned_long,_std::hash<VkRenderPass_T_*>,_std::equal_to<VkRenderPass_T_*>,_std::allocator<std::pair<VkRenderPass_T_*const,_unsigned_long>_>_>
  ::~unordered_map(&this->render_pass_to_hash);
  std::
  unordered_map<VkPipeline_T_*,_unsigned_long,_std::hash<VkPipeline_T_*>,_std::equal_to<VkPipeline_T_*>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>_>
  ::~unordered_map(&this->raytracing_pipeline_to_hash);
  std::
  unordered_map<VkPipeline_T_*,_unsigned_long,_std::hash<VkPipeline_T_*>,_std::equal_to<VkPipeline_T_*>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>_>
  ::~unordered_map(&this->compute_pipeline_to_hash);
  std::
  unordered_map<VkPipeline_T_*,_unsigned_long,_std::hash<VkPipeline_T_*>,_std::equal_to<VkPipeline_T_*>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>_>
  ::~unordered_map(&this->graphics_pipeline_to_hash);
  std::
  unordered_map<VkShaderModule_T_*,_unsigned_long,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_long>_>_>
  ::~unordered_map(&this->shader_module_to_hash);
  std::
  unordered_map<VkPipelineLayout_T_*,_unsigned_long,_std::hash<VkPipelineLayout_T_*>,_std::equal_to<VkPipelineLayout_T_*>,_std::allocator<std::pair<VkPipelineLayout_T_*const,_unsigned_long>_>_>
  ::~unordered_map(&this->pipeline_layout_to_hash);
  std::
  unordered_map<VkDescriptorSetLayout_T_*,_unsigned_long,_std::hash<VkDescriptorSetLayout_T_*>,_std::equal_to<VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>_>_>
  ::~unordered_map(&this->descriptor_set_layout_to_hash);
  std::
  unordered_map<VkSamplerYcbcrConversion_T_*,_const_VkSamplerYcbcrConversionCreateInfo_*,_std::hash<VkSamplerYcbcrConversion_T_*>,_std::equal_to<VkSamplerYcbcrConversion_T_*>,_std::allocator<std::pair<VkSamplerYcbcrConversion_T_*const,_const_VkSamplerYcbcrConversionCreateInfo_*>_>_>
  ::~unordered_map(&this->ycbcr_conversions);
  std::
  unordered_map<unsigned_long,_VkSamplerCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSamplerCreateInfo_*>_>_>
  ::~unordered_map(&this->samplers);
  std::
  unordered_map<unsigned_long,_void_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_*>_>_>
  ::~unordered_map(&this->render_passes);
  std::
  unordered_map<unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkRayTracingPipelineCreateInfoKHR_*>_>_>
  ::~unordered_map(&this->raytracing_pipelines);
  std::
  unordered_map<unsigned_long,_VkComputePipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkComputePipelineCreateInfo_*>_>_>
  ::~unordered_map(&this->compute_pipelines);
  std::
  unordered_map<unsigned_long,_VkGraphicsPipelineCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkGraphicsPipelineCreateInfo_*>_>_>
  ::~unordered_map(&this->graphics_pipelines);
  std::
  unordered_map<unsigned_long,_VkShaderModuleCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModuleCreateInfo_*>_>_>
  ::~unordered_map(&this->shader_modules);
  std::
  unordered_map<unsigned_long,_VkPipelineLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayoutCreateInfo_*>_>_>
  ::~unordered_map(&this->pipeline_layouts);
  std::
  unordered_map<unsigned_long,_VkDescriptorSetLayoutCreateInfo_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkDescriptorSetLayoutCreateInfo_*>_>_>
  ::~unordered_map(&this->descriptor_sets);
  ScratchAllocator::~ScratchAllocator(&this->ycbcr_temp_allocator);
  ScratchAllocator::~ScratchAllocator(&this->temp_allocator);
  ScratchAllocator::~ScratchAllocator(&this->allocator);
  return;
}

Assistant:

StateRecorder::Impl::~Impl()
{
	sync_thread();
}